

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PostDecTestInt64(void)

{
  bool bVar1;
  SafeIntException *anon_var_0;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  long in_stack_ffffffffffffff78;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff80;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff90;
  int iVar2;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffff98;
  string local_60 [40];
  long local_38;
  undefined1 in_stack_ffffffffffffffd7;
  long in_stack_ffffffffffffffd8;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> msg;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_18;
  byte local_9;
  ulong local_8;
  
  for (local_8 = 0; iVar2 = (int)((ulong)in_stack_ffffffffffffff90.m_int >> 0x20), local_8 < 0x11;
      local_8 = local_8 + 1) {
    local_9 = 1;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_18,(long *)(dec_int64 + local_8 * 0x18));
    in_stack_ffffffffffffff90 =
         SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
         operator--(in_stack_ffffffffffffff98,iVar2);
    local_38 = in_stack_ffffffffffffff90.m_int;
    msg = in_stack_ffffffffffffff90;
    bVar1 = operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar1) {
      local_9 = 0;
    }
    if ((local_9 & 1) != (dec_int64[local_8 * 0x18 + 0x10] & 1)) {
      in_stack_ffffffffffffff80.m_int = (long)&stack0xffffffffffffff9f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"Error in case dec_int64 throw (2): ",
                 (allocator *)in_stack_ffffffffffffff80.m_int);
      err_msg<long>((string *)msg.m_int,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
    }
  }
  return;
}

Assistant:

void PostDecTestInt64()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_int64); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int64_t > si(dec_int64[i].x);
			SafeInt< std::int64_t > vv = si--;

			if(vv != dec_int64[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_int64[i].fExpected )
		{
			err_msg( "Error in case dec_int64 throw (2): ", dec_int64[i].x, dec_int64[i].fExpected );
		}
	}
}